

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_string_tests.cpp
# Opt level: O3

void WcsicmpNegativeTest(void)

{
  AssertionResult iutest_ar;
  wchar_t negative_sample [5];
  int *in_stack_fffffffffffffdf8;
  AssertionResult local_200;
  AssertionHelper local_1d8;
  wchar_t local_1a8 [6];
  undefined1 local_190 [392];
  
  local_1a8[0] = L'a';
  local_1a8[1] = L'a';
  local_1a8[2] = L'a';
  local_1a8[3] = L'\xffffffff';
  local_1a8[4] = 0;
  local_190._0_4_ = 0;
  local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ =
       wcscasecmp(L"AAA",local_1a8);
  if ((int)local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p < 1) {
    iutest::internal::CmpHelperOpFailure<int,int>
              (&local_200,(internal *)0x16fae4,
               "::iutest::detail::iu_wcsicmp(L\"AAA\", negative_sample)","<",local_190,
               (int *)&local_1d8,in_stack_fffffffffffffdf8);
    if ((local_200.m_result & 1U) == 0) {
      memset((iu_global_format_stringstream *)local_190,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_190);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,local_200.m_message._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffdff);
      local_1d8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_string_tests.cpp"
      ;
      local_1d8.m_part_result.super_iuCodeMessage.m_line = 0x31;
      local_1d8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1d8,(Fixed *)local_190,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      (int)local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p)
          != &local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 (int)local_1d8.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p),
                        local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_190);
      std::ios_base::~ios_base((ios_base *)(local_190 + 0x80));
    }
  }
  else {
    local_200.m_message._M_dataplus._M_p = (pointer)&local_200.m_message.field_2;
    local_200.m_message._M_string_length = 0;
    local_200.m_message.field_2._M_local_buf[0] = '\0';
    local_200.m_result = true;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.m_message._M_dataplus._M_p != &local_200.m_message.field_2) {
    operator_delete(local_200.m_message._M_dataplus._M_p,
                    CONCAT71(local_200.m_message.field_2._M_allocated_capacity._1_7_,
                             local_200.m_message.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void WcsicmpNegativeTest()
{
    const wchar_t negative = static_cast<wchar_t>(-1);
    const wchar_t negative_sample[] = { L'a', L'a', L'a', negative, L'\0' };
    IUTEST_ASSUME_GE(sizeof(::std::wint_t), sizeof(int));
    IUTEST_EXPECT_LT(0, ::iutest::detail::iu_wcsicmp(L"AAA", negative_sample));
}